

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManElaBestMatch(Nf_Man_t *p,int iObj,int c,Nf_Mat_t *pRes,int Required)

{
  uint *pCutSet;
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint *puVar5;
  int iVar6;
  
  if ((iObj < 0) || ((p->vCutSets).nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar2 = (p->vCutSets).pArray[(uint)iObj];
  uVar3 = (int)uVar2 >> 0x10;
  if ((-1 < (int)uVar3) && ((int)uVar3 < (p->vPages).nSize)) {
    pvVar1 = (p->vPages).pArray[uVar3];
    uVar4 = (ulong)(uVar2 & 0xffff);
    *(undefined8 *)pRes = 0;
    pRes->D = 0x3fffffff;
    pRes->F = 3.4028235e+38;
    uVar2 = *(uint *)((long)pvVar1 + uVar4 * 4);
    if (0 < (int)uVar2) {
      pCutSet = (uint *)((long)pvVar1 + uVar4 * 4);
      iVar6 = 0;
      puVar5 = pCutSet;
      do {
        puVar5 = puVar5 + 1;
        uVar3 = *puVar5;
        if ((int)(uVar3 >> 6) < p->vTt2Match->nSize) {
          Nf_ManElaBestMatchOne(p,iObj,c,(int *)puVar5,(int *)pCutSet,pRes,Required);
          uVar3 = *puVar5;
          uVar2 = *pCutSet;
        }
        iVar6 = iVar6 + 1;
        puVar5 = puVar5 + (uVar3 & 0x1f);
      } while (iVar6 < (int)uVar2);
    }
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Nf_ManElaBestMatch( Nf_Man_t * p, int iObj, int c, Nf_Mat_t * pRes, int Required )
{
    int k, * pCut, * pCutSet = Nf_ObjCutSet( p, iObj );
    memset( pRes, 0, sizeof(Nf_Mat_t) );
    pRes->D = SCL_INFINITY; pRes->F = FLT_MAX;
    Nf_SetForEachCut( pCutSet, pCut, k )
    {
        if ( Abc_Lit2Var(Nf_CutFunc(pCut)) >= Vec_WecSize(p->vTt2Match) )
            continue;
        Nf_ManElaBestMatchOne( p, iObj, c, pCut, pCutSet, pRes, Required );
    }
}